

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

bool tcu::isSRGB(TextureFormat format)

{
  undefined1 local_11;
  undefined4 local_10;
  TextureFormat format_local;
  
  local_10 = format.order;
  local_11 = true;
  if ((((local_10 != sR) && (local_11 = true, local_10 != sRG)) &&
      (local_11 = true, local_10 != sRGB)) &&
     ((local_11 = true, local_10 != sRGBA && (local_11 = true, local_10 != sBGR)))) {
    local_11 = local_10 == sBGRA;
  }
  return local_11;
}

Assistant:

bool isSRGB (TextureFormat format)
{
	// make sure to update this if type table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELORDER_LAST == 21);

	return	format.order == TextureFormat::sR		||
			format.order == TextureFormat::sRG		||
			format.order == TextureFormat::sRGB		||
			format.order == TextureFormat::sRGBA	||
			format.order == TextureFormat::sBGR		||
			format.order == TextureFormat::sBGRA;
}